

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.h
# Opt level: O0

void __thiscall
ExpressionInternal::
ExpressionInternal<std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>,std::unique_ptr<ExpressionInternal,std::default_delete<ExpressionInternal>>>
          (ExpressionInternal *this,OperatorType op,
          unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters,
          unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_1,
          unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_2)

{
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_local_2;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_local_1;
  unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_> *parameters_local;
  OperatorType op_local;
  ExpressionInternal *this_local;
  
  this->type = op;
  std::
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ::vector(&this->children);
  std::variant<std::monostate,_long,_double,_StringLiteral,_Identifier>::variant(&this->value);
  std::
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ::push_back(&this->children,parameters);
  std::
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ::push_back(&this->children,parameters_1);
  std::
  vector<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>,_std::allocator<std::unique_ptr<ExpressionInternal,_std::default_delete<ExpressionInternal>_>_>_>
  ::push_back(&this->children,parameters_2);
  return;
}

Assistant:

ExpressionInternal(OperatorType op, ARGS... parameters) :
		type(op)
	{
		( children.push_back(std::move(parameters)), ... );
	}